

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O1

void __thiscall
luna::CodeGenerateVisitor::InsertName(CodeGenerateVisitor *this,String *name,int register_id)

{
  GenerateFunction *pGVar1;
  GenerateBlock *pGVar2;
  Function *this_00;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  __hash_code __code;
  
  pGVar1 = this->current_function_;
  if ((pGVar1 == (GenerateFunction *)0x0) ||
     (pGVar2 = pGVar1->current_block_, pGVar2 == (GenerateBlock *)0x0)) {
    __assert_fail("current_function_ && current_function_->current_block_",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                  ,0x113,"void luna::CodeGenerateVisitor::InsertName(String *, int)");
  }
  this_00 = pGVar1->function_;
  sVar4 = Function::OpCodeSize(this_00);
  uVar3 = (pGVar2->names_)._M_h._M_bucket_count;
  uVar6 = (ulong)name % uVar3;
  p_Var8 = (pGVar2->names_)._M_h._M_buckets[uVar6];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var8->_M_nxt, p_Var9 = p_Var8, (String *)p_Var8->_M_nxt[1]._M_nxt != name)) {
    while (p_Var8 = p_Var7, p_Var7 = p_Var8->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)p_Var7[1]._M_nxt % uVar3 != uVar6) ||
         (p_Var9 = p_Var8, (String *)p_Var7[1]._M_nxt == name)) goto LAB_00163606;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_00163606:
  if (p_Var9 == (__node_base_ptr)0x0) {
    p_Var7 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var7 = p_Var9->_M_nxt;
  }
  if (p_Var7 == (_Hash_node_base *)0x0) {
    std::
    _Hashtable<luna::String*,std::pair<luna::String*const,luna::LocalNameInfo>,std::allocator<std::pair<luna::String*const,luna::LocalNameInfo>>,std::__detail::_Select1st,std::equal_to<luna::String*>,std::hash<luna::String*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<luna::String*,luna::LocalNameInfo>>
              ((_Hashtable<luna::String*,std::pair<luna::String*const,luna::LocalNameInfo>,std::allocator<std::pair<luna::String*const,luna::LocalNameInfo>>,std::__detail::_Select1st,std::equal_to<luna::String*>,std::hash<luna::String*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&pGVar2->names_);
  }
  else {
    sVar5 = Function::OpCodeSize(this_00);
    Function::AddLocalVar
              (this_00,name,*(int *)&p_Var7[2]._M_nxt,*(int *)((long)&p_Var7[2]._M_nxt + 4),
               (int)sVar5);
    p_Var7[2]._M_nxt = (_Hash_node_base *)((ulong)(uint)register_id | sVar4 << 0x20);
  }
  return;
}

Assistant:

void InsertName(String *name, int register_id)
        {
            assert(current_function_ && current_function_->current_block_);

            auto function = current_function_->function_;
            auto block = current_function_->current_block_;
            auto begin_pc = function->OpCodeSize();

            auto it = block->names_.find(name);
            if (it != block->names_.end())
            {
                // Add the same name variable to the function local variable list
                auto end_pc = function->OpCodeSize();
                function->AddLocalVar(name, it->second.register_id_,
                                      it->second.begin_pc_, end_pc);

                // New variable replace the old one
                it->second = LocalNameInfo(register_id, begin_pc);
            }
            else
            {
                // Variable not existed, then insert into
                LocalNameInfo local(register_id, begin_pc);
                block->names_.insert(std::make_pair(name, local));
            }
        }